

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

void extratLightLine(int imageIndex,Mat *outputImage,structure_light *a)

{
  long lVar1;
  undefined8 uVar2;
  int in_R8D;
  allocator local_529;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  allmaskPoint;
  Point maskPoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempPointSet;
  _Vector_base<int,_std::allocator<int>_> local_4e8;
  _InputArray local_4d0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  Mat mask;
  undefined1 auStack_4a4 [12];
  _InputArray *p_Stack_4a0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> maskPointSet;
  string index;
  string num;
  Mat element2;
  undefined1 auStack_3e4 [12];
  _InputArray *p_Stack_3e0;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [21];
  undefined8 local_220;
  string name2;
  string name1;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  Mat element1;
  Mat diff;
  Mat oriImage;
  undefined8 *local_b0;
  Mat lightImage;
  
  std::__cxx11::to_string(&num,imageIndex);
  std::__cxx11::string::string((string *)&index,".jpg",(allocator *)local_388);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                 "./calib_picture/calib",&num);
  std::operator+(&name1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_388,&index);
  std::__cxx11::string::~string((string *)local_388);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                 "./light_picture/light",&num);
  std::operator+(&name2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_388,&index);
  std::__cxx11::string::~string((string *)local_388);
  cv::imread((string *)&oriImage,(int)&name1);
  cv::imread((string *)&lightImage,(int)&name2);
  local_378[0]._M_allocated_capacity = 0;
  local_388._0_4_ = 0x1010000;
  local_388._8_8_ = (string *)&oriImage;
  _diff = 0x2010000;
  cv::cvtColor((cv *)local_388,(_InputArray *)&diff,(_OutputArray *)0x6,0,in_R8D);
  local_378[0]._M_allocated_capacity = 0;
  local_388._0_4_ = 0x1010000;
  local_388._8_8_ = (string *)&lightImage;
  _diff = 0x2010000;
  cv::cvtColor((cv *)local_388,(_InputArray *)&diff,(_OutputArray *)0x6,0,in_R8D);
  cv::Mat::Mat(&diff);
  local_378[0]._M_allocated_capacity = 0;
  local_388._0_4_ = 0x1010000;
  local_388._8_8_ = (string *)&oriImage;
  _element1 = 0x1010000;
  _element2 = 0x2010000;
  p_Stack_3e0 = (_InputArray *)&diff;
  cv::absdiff((_InputArray *)local_388,(_InputArray *)&element1,(_OutputArray *)&element2);
  std::__cxx11::string::string((string *)local_388,"./save/diff.jpg",(allocator *)&mask);
  _element1 = 0x1010000;
  _element2 = (undefined1  [16])0x0;
  cv::imwrite((string *)local_388,(_InputArray *)&element1,(vector *)&element2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&element2);
  std::__cxx11::string::~string((string *)local_388);
  local_1b8 = 0x300000003;
  local_1c0 = 0xffffffffffffffff;
  cv::getStructuringElement(&element1,0);
  _element2 = 0x1010000;
  _mask = 0x2010000;
  p_Stack_4a0 = (_InputArray *)&diff;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&element1;
  local_4b0 = 0xffffffffffffffff;
  cv::morphologyDefaultBorderValue();
  cv::morphologyEx(&element2,&mask,2,&allmaskPoint,&local_4b0,1,0,local_388);
  std::__cxx11::string::string((string *)local_388,"./save/open.jpg",(allocator *)&allmaskPoint);
  _element2 = 0x1010000;
  _mask = (undefined1  [16])0x0;
  cv::imwrite((string *)local_388,(_InputArray *)&element2,(vector *)&mask);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&mask);
  std::__cxx11::string::~string((string *)local_388);
  local_378[0]._M_allocated_capacity = 0;
  local_388._0_4_ = 0x1010000;
  local_388._8_8_ = (_InputArray *)&diff;
  _element2 = 0x2010000;
  cv::threshold((_InputArray *)local_388,(_OutputArray *)&element2,30.0,255.0,0);
  std::__cxx11::string::string
            ((string *)local_388,"./save/threshold.jpg",(allocator *)&allmaskPoint);
  _element2 = 0x1010000;
  _mask = (undefined1  [16])0x0;
  cv::imwrite((string *)local_388,(_InputArray *)&element2,(vector *)&mask);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&mask);
  std::__cxx11::string::~string((string *)local_388);
  local_1c8 = 0x500000005;
  local_1d0 = 0xffffffffffffffff;
  cv::getStructuringElement((pointer)&element2,0);
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _mask = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&diff;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_4b8 = 0xffffffffffffffff;
  tempPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&element2;
  cv::morphologyDefaultBorderValue();
  cv::erode(&mask,&allmaskPoint,&tempPointSet,&local_4b8,1,0,local_388);
  std::__cxx11::string::string((string *)local_388,"./save/erode.jpg",(allocator *)&tempPointSet);
  _mask = 0x1010000;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::imwrite((string *)local_388,(_InputArray *)&mask,(vector *)&allmaskPoint);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&allmaskPoint);
  std::__cxx11::string::~string((string *)local_388);
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allmaskPoint.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388 = (undefined1  [16])0x0;
  local_378[0]._M_allocated_capacity = 0;
  std::
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
            ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
              *)&allmaskPoint,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_388);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_388);
  local_220 = CONCAT44((int)*local_b0,(int)((ulong)*local_b0 >> 0x20));
  cv::Mat::zeros(local_388,&local_220,0);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&mask);
  cv::MatExpr::~MatExpr((MatExpr *)local_388);
  maskPoint.x = 0;
  maskPoint.y = 0;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&tempPointSet,
             (a->calibImagePoint).
             super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + imageIndex);
  maskPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  maskPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  maskPointSet.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  maskPoint.y = (int)ROUND(((float *)
                           CONCAT44(tempPointSet.
                                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    tempPointSet.
                                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_))[1]);
  maskPoint.x = (int)ROUND(*(float *)CONCAT44(tempPointSet.
                                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              tempPointSet.
                                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar1 = (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -4
                                     + lVar1 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8
                                     + lVar1 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar1 = (long)(a->patternSize).height * (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -4
                                     + lVar1 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8
                                     + lVar1 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  lVar1 = ((long)(a->patternSize).height + -1) * (long)(a->patternSize).width;
  maskPoint.y = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + 4
                                     + lVar1 * 8));
  maskPoint.x = (int)ROUND(*(float *)(CONCAT44(tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               tempPointSet.
                                               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar1 * 8));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
            (allmaskPoint.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&maskPoint);
  local_4d0.sz.width = 0;
  local_4d0.sz.height = 0;
  local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0.flags = 0x3010000;
  local_4e8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8104000c;
  local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)&allmaskPoint;
  local_4d0.obj = (MatExpr *)&mask;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_388,255.0);
  uVar2 = cv::noArray();
  local_1d8 = 0;
  cv::drawContours(&local_4d0,&local_4e8,0,local_388,0xffffffffffffffff,8,uVar2,0x7fffffff,
                   &local_1d8);
  local_378[0]._M_allocated_capacity = 0;
  local_4d0.sz.width = 0;
  local_4d0.sz.height = 0;
  local_388._0_4_ = 0x2010000;
  local_388._8_8_ = outputImage;
  local_4d0.flags = 0x1010000;
  local_4d0.obj = (MatExpr *)&mask;
  cv::Mat::copyTo((_OutputArray *)&diff,(_InputArray *)local_388);
  std::__cxx11::string::string((string *)local_388,"./save/mask.jpg",&local_529);
  local_4d0.sz.width = 0;
  local_4d0.sz.height = 0;
  local_4d0.flags = 0x1010000;
  local_4e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0.obj = (MatExpr *)&mask;
  cv::imwrite((string *)local_388,&local_4d0,(vector *)&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::string((string *)local_388,"./save/ROI.jpg",&local_529);
  local_4d0.sz.width = 0;
  local_4d0.sz.height = 0;
  local_4d0.flags = 0x1010000;
  local_4e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0.obj = outputImage;
  cv::imwrite((string *)local_388,&local_4d0,(vector *)&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  std::__cxx11::string::~string((string *)local_388);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&maskPointSet.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&tempPointSet.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  cv::Mat::~Mat(&mask);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&allmaskPoint);
  cv::Mat::~Mat(&element2);
  cv::Mat::~Mat(&element1);
  cv::Mat::~Mat(&diff);
  cv::Mat::~Mat(&lightImage);
  cv::Mat::~Mat(&oriImage);
  std::__cxx11::string::~string((string *)&name2);
  std::__cxx11::string::~string((string *)&name1);
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::string::~string((string *)&num);
  return;
}

Assistant:

void extratLightLine(int imageIndex, Mat &outputImage, structure_light &a)
{
    string num = to_string(imageIndex);
    string index = ".jpg";
    string name1 = "./calib_picture/calib" + num + index;
    string name2 = "./light_picture/light" + num + index;

    Mat oriImage = imread(name1);
    Mat lightImage = imread(name2);

    cvtColor(oriImage, oriImage, COLOR_BGR2GRAY);
    cvtColor(lightImage, lightImage, COLOR_BGR2GRAY);
    Mat diff;
    absdiff(oriImage, lightImage, diff);
    imwrite("./save/diff.jpg", diff);

    Mat element1 = getStructuringElement(MORPH_RECT, Size(3, 3));
    morphologyEx(diff, diff, MORPH_OPEN, element1);
    imwrite("./save/open.jpg", diff);

    threshold(diff, diff, 30, 255, THRESH_BINARY);
    imwrite("./save/threshold.jpg", diff);

    Mat element2 = getStructuringElement(MORPH_RECT, Size(5, 5));
    erode(diff, diff, element2);
    imwrite("./save/erode.jpg", diff);

    vector<vector<Point>>  allmaskPoint;
    allmaskPoint.push_back(vector<Point>());
    Mat mask = Mat::zeros(oriImage.size(), CV_8UC1);
    Point2f tempPoint;
    Point maskPoint;
    vector<Point2f> tempPointSet = a.calibImagePoint[imageIndex];
    vector<Point2f> maskPointSet;

    tempPoint = tempPointSet[0];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*a.patternSize.height - 1];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    tempPoint = tempPointSet[a.patternSize.width*(a.patternSize.height - 1)];
    maskPoint.x = cvRound(tempPoint.x);
    maskPoint.y = cvRound(tempPoint.y);
    allmaskPoint[0].push_back(maskPoint);

    drawContours(mask, allmaskPoint, 0, Scalar(255), FILLED, 8);
    diff.copyTo(outputImage, mask);
    imwrite("./save/mask.jpg", mask);
    imwrite("./save/ROI.jpg", outputImage);

}